

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

bool __thiscall
spirv_cross::CompilerMSL::add_component_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRVariable *var,
          SPIRType *type,InterfaceBlockMeta *meta)

{
  uint32_t uVar1;
  size_t sVar2;
  pointer pcVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  iterator iVar7;
  SPIREntryPoint *pSVar8;
  SPIRFunction *pSVar9;
  _func_void *p_Var10;
  uint32_t local_9c;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  CompilerMSL *local_68;
  undefined1 *local_60;
  long local_58;
  undefined1 local_50 [16];
  uint32_t local_40;
  uint32_t uStack_3c;
  uint32_t local_38;
  
  bVar4 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation);
  if (bVar4) {
    local_9c = Compiler::get_decoration
                         ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation);
    iVar7 = ::std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::CompilerMSL::InterfaceBlockMeta::LocationMeta>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::CompilerMSL::InterfaceBlockMeta::LocationMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::CompilerMSL::InterfaceBlockMeta::LocationMeta>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::CompilerMSL::InterfaceBlockMeta::LocationMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)meta,&local_9c);
    if (iVar7.
        super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::CompilerMSL::InterfaceBlockMeta::LocationMeta>,_false>
        ._M_cur != (__node_type *)0x0) {
      bVar4 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation);
      if ((bVar4) && ((this->msl_options).pad_fragment_output_components == true)) {
        pSVar8 = Compiler::get_entry_point((Compiler *)this);
        bVar4 = storage == Output && pSVar8->model == ExecutionModelFragment;
      }
      else {
        bVar4 = false;
      }
      pSVar9 = Variant::get<spirv_cross::SPIRFunction>
                         ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr +
                          (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
      uVar5 = Compiler::get_decoration((Compiler *)this,(ID)(var->super_IVariant).self.id,Component)
      ;
      uVar1 = type->vecsize;
      if (bVar4) {
        uVar6 = Compiler::get_decoration
                          ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation);
        local_78 = (SPIRType *)CONCAT44(local_78._4_4_,uVar6);
        ::std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::find(&(this->fragment_output_components)._M_h,(key_type *)&local_78);
      }
      uVar6 = (var->super_IVariant).self.id;
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::reserve
                (&pSVar9->local_variables,
                 (pSVar9->local_variables).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size + 1);
      sVar2 = (pSVar9->local_variables).
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
      (pSVar9->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr
      [sVar2].id = uVar6;
      (pSVar9->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
      buffer_size = sVar2 + 1;
      uVar6 = (var->super_IVariant).self.id;
      SmallVector<unsigned_int,_8UL>::reserve
                (&this->vars_needing_early_declaration,
                 (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size +
                 1);
      sVar2 = (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size;
      (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.ptr[sVar2] = uVar6;
      (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size = sVar2 + 1;
      local_78 = type;
      uStack_70 = var;
      local_68 = this;
      uStack_3c = uVar1;
      local_38 = uVar5;
      if (var->storage == Input) {
        local_60 = local_50;
        pcVar3 = (ib_var_ref->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_60,pcVar3,pcVar3 + ib_var_ref->_M_string_length);
        local_40 = local_9c;
        local_98._M_unused._M_object = (void *)0x0;
        local_98._8_8_ = 0;
        local_88 = (code *)0x0;
        pcStack_80 = (code *)0x0;
        p_Var10 = (_func_void *)operator_new(0x48);
        *(CompilerMSL **)(p_Var10 + 0x10) = local_68;
        *(key_type *)p_Var10 = (key_type)local_78;
        *(key_type *)(p_Var10 + 4) = local_78._4_4_;
        *(key_type *)(p_Var10 + 8) = (key_type)uStack_70;
        *(key_type *)(p_Var10 + 0xc) = uStack_70._4_4_;
        *(_func_void **)(p_Var10 + 0x18) = p_Var10 + 0x28;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)(p_Var10 + 0x18),local_60,local_60 + local_58);
        *(uint32_t *)(p_Var10 + 0x40) = local_38;
        *(ulong *)(p_Var10 + 0x38) = CONCAT44(uStack_3c,local_40);
        pcStack_80 = ::std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:2632:40)>
                     ::_M_invoke;
        local_88 = ::std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:2632:40)>
                   ::_M_manager;
        local_98._M_unused._M_function_pointer = p_Var10;
        SmallVector<std::function<void_()>,_0UL>::push_back
                  (&pSVar9->fixup_hooks_in,(function<void_()> *)&local_98);
        if (local_88 != (code *)0x0) {
          (*local_88)(&local_98,&local_98,__destroy_functor);
        }
      }
      else {
        local_60 = local_50;
        pcVar3 = (ib_var_ref->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_60,pcVar3,pcVar3 + ib_var_ref->_M_string_length);
        local_40 = local_9c;
        local_98._M_unused._M_object = (void *)0x0;
        local_98._8_8_ = 0;
        local_88 = (code *)0x0;
        pcStack_80 = (code *)0x0;
        p_Var10 = (_func_void *)operator_new(0x48);
        *(CompilerMSL **)(p_Var10 + 0x10) = local_68;
        *(key_type *)p_Var10 = (key_type)local_78;
        *(key_type *)(p_Var10 + 4) = local_78._4_4_;
        *(key_type *)(p_Var10 + 8) = (key_type)uStack_70;
        *(key_type *)(p_Var10 + 0xc) = uStack_70._4_4_;
        *(_func_void **)(p_Var10 + 0x18) = p_Var10 + 0x28;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)(p_Var10 + 0x18),local_60,local_60 + local_58);
        *(uint32_t *)(p_Var10 + 0x40) = local_38;
        *(ulong *)(p_Var10 + 0x38) = CONCAT44(uStack_3c,local_40);
        pcStack_80 = ::std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:2652:41)>
                     ::_M_invoke;
        local_88 = ::std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:2652:41)>
                   ::_M_manager;
        local_98._M_unused._M_function_pointer = p_Var10;
        SmallVector<std::function<void_()>,_0UL>::push_back
                  (&pSVar9->fixup_hooks_out,(function<void_()> *)&local_98);
        if (local_88 != (code *)0x0) {
          (*local_88)(&local_98,&local_98,__destroy_functor);
        }
      }
      if (local_60 != local_50) {
        operator_delete(local_60);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool CompilerMSL::add_component_variable_to_interface_block(spv::StorageClass storage, const std::string &ib_var_ref,
                                                            SPIRVariable &var,
                                                            const SPIRType &type,
                                                            InterfaceBlockMeta &meta)
{
	// Deal with Component decorations.
	const InterfaceBlockMeta::LocationMeta *location_meta = nullptr;
	uint32_t location = ~0u;
	if (has_decoration(var.self, DecorationLocation))
	{
		location = get_decoration(var.self, DecorationLocation);
		auto location_meta_itr = meta.location_meta.find(location);
		if (location_meta_itr != end(meta.location_meta))
			location_meta = &location_meta_itr->second;
	}

	// Check if we need to pad fragment output to match a certain number of components.
	if (location_meta)
	{
		bool pad_fragment_output = has_decoration(var.self, DecorationLocation) &&
		                           msl_options.pad_fragment_output_components &&
		                           get_entry_point().model == ExecutionModelFragment && storage == StorageClassOutput;

		auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
		uint32_t start_component = get_decoration(var.self, DecorationComponent);
		uint32_t type_components = type.vecsize;
		uint32_t num_components = location_meta->num_components;

		if (pad_fragment_output)
		{
			uint32_t locn = get_decoration(var.self, DecorationLocation);
			num_components = max<uint32_t>(num_components, get_target_components_for_fragment_location(locn));
		}

		// We have already declared an IO block member as m_location_N.
		// Just emit an early-declared variable and fixup as needed.
		// Arrays need to be unrolled here since each location might need a different number of components.
		entry_func.add_local_variable(var.self);
		vars_needing_early_declaration.push_back(var.self);

		if (var.storage == StorageClassInput)
		{
			entry_func.fixup_hooks_in.push_back([=, &type, &var]() {
				if (!type.array.empty())
				{
					uint32_t array_size = to_array_size_literal(type);
					for (uint32_t loc_off = 0; loc_off < array_size; loc_off++)
					{
						statement(to_name(var.self), "[", loc_off, "]", " = ", ib_var_ref,
						          ".m_location_", location + loc_off,
						          vector_swizzle(type_components, start_component), ";");
					}
				}
				else
				{
					statement(to_name(var.self), " = ", ib_var_ref, ".m_location_", location,
					          vector_swizzle(type_components, start_component), ";");
				}
			});
		}
		else
		{
			entry_func.fixup_hooks_out.push_back([=, &type, &var]() {
				if (!type.array.empty())
				{
					uint32_t array_size = to_array_size_literal(type);
					for (uint32_t loc_off = 0; loc_off < array_size; loc_off++)
					{
						statement(ib_var_ref, ".m_location_", location + loc_off,
						          vector_swizzle(type_components, start_component), " = ",
						          to_name(var.self), "[", loc_off, "];");
					}
				}
				else
				{
					statement(ib_var_ref, ".m_location_", location,
					          vector_swizzle(type_components, start_component), " = ", to_name(var.self), ";");
				}
			});
		}
		return true;
	}
	else
		return false;
}